

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O3

void Vec_StrPrintNum(Vec_Str_t *p,int Num)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char Digits [16];
  char local_38 [24];
  
  if (Num == 0) {
    uVar5 = p->nSize;
    if (uVar5 == p->nCap) {
      if ((int)uVar5 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar4;
        p->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar5 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar3);
        }
        else {
          pcVar4 = (char *)realloc(p->pArray,sVar3);
        }
        p->pArray = pcVar4;
        p->nCap = (int)sVar3;
      }
    }
    else {
      pcVar4 = p->pArray;
    }
    iVar2 = p->nSize;
    p->nSize = iVar2 + 1;
    pcVar4[iVar2] = '0';
  }
  else {
    uVar6 = (ulong)(uint)Num;
    if (Num < 0) {
      uVar5 = p->nSize;
      if (uVar5 == p->nCap) {
        if ((int)uVar5 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(0x10);
          }
          else {
            pcVar4 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar4;
          p->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar5 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(sVar3);
          }
          else {
            pcVar4 = (char *)realloc(p->pArray,sVar3);
          }
          p->pArray = pcVar4;
          p->nCap = (int)sVar3;
        }
      }
      else {
        pcVar4 = p->pArray;
      }
      iVar2 = p->nSize;
      p->nSize = iVar2 + 1;
      pcVar4[iVar2] = '-';
      uVar6 = (ulong)(uint)-Num;
    }
    uVar7 = 0xffffffffffffffff;
    do {
      uVar5 = (uint)uVar6;
      local_38[uVar7 + 1] = (char)uVar6 + (char)(uVar6 / 10) * -10;
      uVar7 = uVar7 + 1;
      uVar6 = uVar6 / 10;
    } while (9 < uVar5);
    do {
      cVar1 = local_38[uVar7 & 0xffffffff];
      uVar5 = p->nSize;
      if (uVar5 == p->nCap) {
        if ((int)uVar5 < 0x10) {
          if (p->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(0x10);
          }
          else {
            pcVar4 = (char *)realloc(p->pArray,0x10);
          }
          p->pArray = pcVar4;
          p->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar5 * 2;
          if (p->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(sVar3);
          }
          else {
            pcVar4 = (char *)realloc(p->pArray,sVar3);
          }
          p->pArray = pcVar4;
          p->nCap = (int)sVar3;
        }
      }
      else {
        pcVar4 = p->pArray;
      }
      iVar2 = p->nSize;
      p->nSize = iVar2 + 1;
      pcVar4[iVar2] = cVar1 + '0';
      uVar7 = uVar7 - 1;
    } while (1 < (int)uVar7 + 2);
  }
  return;
}

Assistant:

static inline void Vec_StrPrintNum( Vec_Str_t * p, int Num )
{
    int i;
    char Digits[16];
    if ( Num == 0 )
    {
        Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i--; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}